

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_vfs_unregister(sqlite3_vfs *pVfs)

{
  sqlite3_vfs *in_RDI;
  int rc;
  sqlite3_mutex *mutex;
  int in_stack_ffffffffffffffdc;
  undefined4 local_4;
  
  local_4 = sqlite3_initialize();
  if (local_4 == 0) {
    sqlite3MutexAlloc(in_stack_ffffffffffffffdc);
    sqlite3_mutex_enter((sqlite3_mutex *)0x132c7f);
    vfsUnlink(in_RDI);
    sqlite3_mutex_leave((sqlite3_mutex *)0x132c93);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

SQLITE_API int sqlite3_vfs_unregister(sqlite3_vfs *pVfs){
  MUTEX_LOGIC(sqlite3_mutex *mutex;)
#ifndef SQLITE_OMIT_AUTOINIT
  int rc = sqlite3_initialize();
  if( rc ) return rc;
#endif
  MUTEX_LOGIC( mutex = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MAIN); )
  sqlite3_mutex_enter(mutex);
  vfsUnlink(pVfs);
  sqlite3_mutex_leave(mutex);
  return SQLITE_OK;
}